

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O2

void mpp_sthd_grp_put(MppSThdGrp grp)

{
  MppSThdImpl *thd;
  long lVar1;
  
  if (grp == (MppSThdGrp)0x0) {
    _mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"impl","mpp_sthd_grp_put"
               ,0x212);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001183bd;
  }
  if (1 < *(uint *)((long)grp + 0x14)) {
    _mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,
               "impl->status == MPP_STHD_UNINITED || impl->status == MPP_STHD_READY",
               "mpp_sthd_grp_put",0x213);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001183bd:
      abort();
    }
  }
  thd = (MppSThdImpl *)((long)grp + 0x40);
  for (lVar1 = 0; lVar1 < *(int *)((long)grp + 0x10); lVar1 = lVar1 + 1) {
    mpp_sthd_deinit(thd);
    thd = thd + 1;
  }
  mpp_osal_free("mpp_sthd_grp_put",grp);
  return;
}

Assistant:

void mpp_sthd_grp_put(MppSThdGrp grp)
{
    MppSThdGrpImpl *impl = (MppSThdGrpImpl *)grp;
    RK_S32 i;

    mpp_assert(impl);
    mpp_assert(impl->status == MPP_STHD_UNINITED || impl->status == MPP_STHD_READY);

    for (i = 0; i < impl->count; i++) {
        MppSThdImpl *thd = &impl->thds[i];

        mpp_sthd_deinit(thd);
    }

    mpp_free(impl);
}